

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostringstream.cc
# Opt level: O2

int_type __thiscall strings::OStringStream::overflow(OStringStream *this,int c)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_ostream).field_0x8;
  if (lVar1 != 0) {
    if (c != -1) {
      std::__cxx11::string::push_back((char)lVar1);
    }
    return 1;
  }
  __assert_fail("s_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/strings/ostringstream.cc"
                ,0x17,"virtual OStringStream::Buf::int_type strings::OStringStream::overflow(int)");
}

Assistant:

OStringStream::Buf::int_type OStringStream::overflow(int c) {
  assert(s_);
  if (!Buf::traits_type::eq_int_type(c, Buf::traits_type::eof()))
    s_->push_back(static_cast<char>(c));
  return 1;
}